

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O2

void __thiscall zmq::mailbox_t::~mailbox_t(mailbox_t *this)

{
  mutex_t *this_00;
  
  this_00 = &this->_sync;
  mutex_t::lock(this_00);
  mutex_t::unlock(this_00);
  mutex_t::~mutex_t(this_00);
  signaler_t::~signaler_t(&this->_signaler);
  yqueue_t<zmq::command_t,_16>::~yqueue_t(&(this->_cpipe)._queue);
  return;
}

Assistant:

zmq::mailbox_t::~mailbox_t ()
{
    //  TODO: Retrieve and deallocate commands inside the _cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync.lock ();
    _sync.unlock ();
}